

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[61]>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,char (*args_1) [61])

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *local_130;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_110 [40];
  string local_e8 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_c8;
  function<void()> local_b0 [32];
  tuple<char_data_*&,_const_char_(&)[61]> tuple;
  anon_class_80_3_3bdf3dc2 local_80;
  
  nTimer_local = nTimer;
  local_130 = func;
  if (nTimer < 0) {
    local_110._0_8_ = 2;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_110);
  }
  tuple.super__Tuple_impl<0UL,_char_data_*&,_const_char_(&)[61]>.
  super__Tuple_impl<1UL,_const_char_(&)[61]>.super__Head_base<1UL,_const_char_(&)[61],_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_(&)[61],_false>)
                 (_Head_base<1UL,_const_char_(&)[61],_false>)args_1;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_const_char_(&)[61]>.
  super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,char_const(&)[61]>(&chs,this,&tuple);
  local_110._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_110 + 8),(string *)from);
  std::__cxx11::string::string(local_e8,(string *)funcName);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_c8,&chs);
  local_80.func = local_130;
  local_80.args = *args;
  local_80._16_1_ = *(char *)((long)args_1 + 0);
  local_80._17_1_ = *(char *)((long)args_1 + 1);
  local_80._18_1_ = *(char *)((long)args_1 + 2);
  local_80._19_1_ = *(char *)((long)args_1 + 3);
  local_80._20_1_ = *(char *)((long)args_1 + 4);
  local_80._21_1_ = *(char *)((long)args_1 + 5);
  local_80._22_1_ = *(char *)((long)args_1 + 6);
  local_80._23_1_ = *(char *)((long)args_1 + 7);
  local_80._24_1_ = *(char *)((long)args_1 + 8);
  local_80._25_1_ = *(char *)((long)args_1 + 9);
  local_80._26_1_ = *(char *)((long)args_1 + 10);
  local_80._27_1_ = *(char *)((long)args_1 + 0xb);
  local_80._28_1_ = *(char *)((long)args_1 + 0xc);
  local_80._29_1_ = *(char *)((long)args_1 + 0xd);
  local_80._30_1_ = *(char *)((long)args_1 + 0xe);
  local_80._31_1_ = *(char *)((long)args_1 + 0xf);
  local_80._32_1_ = *(char *)((long)args_1 + 0x10);
  local_80._33_1_ = *(char *)((long)args_1 + 0x11);
  local_80._34_1_ = *(char *)((long)args_1 + 0x12);
  local_80._35_1_ = *(char *)((long)args_1 + 0x13);
  local_80._36_1_ = *(char *)((long)args_1 + 0x14);
  local_80._37_1_ = *(char *)((long)args_1 + 0x15);
  local_80._38_1_ = *(char *)((long)args_1 + 0x16);
  local_80._39_1_ = *(char *)((long)args_1 + 0x17);
  local_80._40_1_ = *(char *)((long)args_1 + 0x18);
  local_80._41_1_ = *(char *)((long)args_1 + 0x19);
  local_80._42_1_ = *(char *)((long)args_1 + 0x1a);
  local_80._43_1_ = *(char *)((long)args_1 + 0x1b);
  local_80._44_1_ = *(char *)((long)args_1 + 0x1c);
  local_80._45_1_ = *(char *)((long)args_1 + 0x1d);
  local_80._46_1_ = *(char *)((long)args_1 + 0x1e);
  local_80._47_1_ = *(char *)((long)args_1 + 0x1f);
  local_80._48_1_ = *(char *)((long)args_1 + 0x20);
  local_80._49_1_ = *(char *)((long)args_1 + 0x21);
  local_80._50_1_ = *(char *)((long)args_1 + 0x22);
  local_80._51_1_ = *(char *)((long)args_1 + 0x23);
  local_80._52_1_ = *(char *)((long)args_1 + 0x24);
  local_80._53_1_ = *(char *)((long)args_1 + 0x25);
  local_80._54_1_ = *(char *)((long)args_1 + 0x26);
  local_80._55_1_ = *(char *)((long)args_1 + 0x27);
  local_80._69_1_ = *(char *)((long)args_1 + 0x35);
  local_80._70_1_ = *(char *)((long)args_1 + 0x36);
  local_80._71_1_ = *(char *)((long)args_1 + 0x37);
  local_80._72_1_ = *(char *)((long)args_1 + 0x38);
  local_80._73_1_ = *(char *)((long)args_1 + 0x39);
  local_80._74_1_ = *(char *)((long)args_1 + 0x3a);
  local_80._75_1_ = *(char *)((long)args_1 + 0x3b);
  local_80._76_1_ = *(char *)((long)args_1 + 0x3c);
  local_80._56_5_ = SUB85(*(undefined8 *)(*args_1 + 0x28),0);
  local_80._61_3_ = SUB83(*(undefined8 *)(*args_1 + 0x2d),0);
  local_80._64_5_ = SUB85((ulong)*(undefined8 *)(*args_1 + 0x2d) >> 0x18,0);
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[61]>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[61])::_lambda()_1_,void>
            (local_b0,&local_80);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_110);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_110);
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,funcName,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}